

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

int __thiscall Fl_Browser::item_width(Fl_Browser *this,void *item)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  int iVar8;
  int *piVar9;
  double dVar10;
  ulong uStack_50;
  byte *local_40;
  void *local_38;
  
  pbVar6 = (byte *)((long)item + 0x23);
  piVar9 = this->column_widths_;
  cVar2 = this->column_char_;
  iVar8 = 0;
  local_38 = item;
  while ((iVar4 = *piVar9, iVar4 != 0 &&
         (pcVar5 = strchr((char *)pbVar6,(int)cVar2), pcVar5 != (char *)0x0))) {
    pbVar6 = (byte *)(pcVar5 + 1);
    piVar9 = piVar9 + 1;
    iVar8 = iVar8 + iVar4;
  }
  uVar7 = (ulong)(uint)(this->super_Fl_Browser_).textfont_;
  uStack_50 = (ulong)(uint)(this->super_Fl_Browser_).textsize_;
  local_40 = pbVar6;
  do {
    if (((*local_40 != this->format_char_) || (bVar3 = local_40[1], bVar3 == 0)) ||
       (bVar3 == *local_40)) goto LAB_001a5cba;
    pbVar6 = local_40 + 2;
    switch(bVar3) {
    case 0x66:
    case 0x74:
      uVar7 = 4;
      break;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
      break;
    case 0x69:
      uVar7 = (ulong)((uint)uVar7 | 2);
      break;
    case 0x6c:
switchD_001a5c12_caseD_4c:
      uStack_50 = 0x18;
      break;
    case 0x6d:
switchD_001a5c12_caseD_4d:
      uStack_50 = 0x12;
      break;
    case 0x73:
      uStack_50 = 0xb;
      break;
    default:
      switch(bVar3) {
      case 0x40:
        local_40 = local_40 + 1;
LAB_001a5cba:
        pbVar6 = local_40;
        if ((*local_40 == this->format_char_) && (local_40[1] != 0)) {
          pbVar6 = local_40 + 1;
        }
        if (iVar8 == 0) {
          if (*(long *)((long)local_38 + 0x18) == 0) {
            iVar8 = 0;
          }
          else {
            iVar8 = *(int *)(*(long *)((long)local_38 + 0x18) + 8);
          }
        }
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
                  (fl_graphics_driver,uVar7 & 0xffffffff,uStack_50 & 0xffffffff);
        dVar10 = fl_width((char *)pbVar6);
        return (int)dVar10 + iVar8 + 6;
      case 0x41:
      case 0x44:
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
        break;
      case 0x42:
      case 0x43:
        pbVar6 = local_40 + 1;
        do {
          pbVar1 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
        } while (*pbVar1 - 0x30 < 10);
        break;
      case 0x46:
        local_40 = pbVar6;
        uVar7 = strtol((char *)pbVar6,(char **)&local_40,10);
        pbVar6 = local_40;
        break;
      case 0x4c:
        goto switchD_001a5c12_caseD_4c;
      case 0x4d:
        goto switchD_001a5c12_caseD_4d;
      default:
        if (bVar3 == 0x53) {
          local_40 = pbVar6;
          uStack_50 = strtol((char *)pbVar6,(char **)&local_40,10);
          pbVar6 = local_40;
        }
        else if (bVar3 == 0x62) {
          uVar7 = (ulong)((uint)uVar7 | 1);
        }
        else {
          local_40 = pbVar6;
          if (bVar3 == 0x2e) goto LAB_001a5cba;
        }
      }
    }
    local_40 = pbVar6;
  } while( true );
}

Assistant:

int Fl_Browser::item_width(void *item) const {
  FL_BLINE* l=(FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();
  int ww = 0;

  while (*i) { // add up all tab-separated fields
    char* e;
    e = strchr(str, column_char());
    if (!e) break; // last one occupied by text
    str = e+1;
    ww += *i++;
  }

  // OK, we gotta parse the string and find the string width...
  int tsize = textsize();
  Fl_Font font = textfont();
  int done = 0;

  while (*str == format_char_ && str[1] && str[1] != format_char_) {
    str ++;
    switch (*str++) {
    case 'l': case 'L': tsize = 24; break;
    case 'm': case 'M': tsize = 18; break;
    case 's': tsize = 11; break;
    case 'b': font = (Fl_Font)(font|FL_BOLD); break;
    case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
    case 'f': case 't': font = FL_COURIER; break;
    case 'B':
    case 'C': while (isdigit(*str & 255)) str++; break; // skip a color number
    case 'F': font = (Fl_Font)strtol(str, &str, 10); break;
    case 'S': tsize = strtol(str, &str, 10); break;
    case '.':
      done = 1;
      break;
    case '@':
      str--;
      done = 1;
    }

    if (done)
      break;
  }

  if (*str == format_char_ && str[1])
    str ++;

  if (ww==0 && l->icon) ww = l->icon->w();

  fl_font(font, tsize);
  return ww + int(fl_width(str)) + 6;
}